

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurface.hpp
# Opt level: O2

PixelBufferAccess * __thiscall
tcu::Surface::getAccess(PixelBufferAccess *__return_storage_ptr__,Surface *this)

{
  void *data;
  TextureFormat local_10;
  
  local_10.order = RGBA;
  local_10.type = UNORM_INT8;
  data = (void *)(this->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (this->m_pixels).m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&local_10,this->m_width,this->m_height,1,data);
  return __return_storage_ptr__;
}

Assistant:

inline PixelBufferAccess Surface::getAccess (void)
{
	return PixelBufferAccess(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_width, m_height, 1, m_pixels.empty() ? DE_NULL : m_pixels.getPtr());
}